

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcxx_eh.cc
# Opt level: O0

_Unwind_Exception * objc_init_cxx_exception(id obj)

{
  undefined8 *ptr;
  __int_type _Var1;
  _Unwind_Exception *ptr_00;
  __int_type_conflict offset;
  type_info **pptVar2;
  long lVar3;
  _Unwind_Exception *ex;
  id *newEx;
  id obj_local;
  
  ptr = (undefined8 *)__cxa_allocate_exception(8);
  *ptr = obj;
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base *)&(anonymous_namespace)::exception_struct_size);
  ptr_00 = pointer_add<_Unwind_Exception>(ptr,-_Var1);
  offset = std::__atomic_base::operator_cast_to_long
                     ((__atomic_base *)&(anonymous_namespace)::type_info_offset);
  pptVar2 = pointer_add<std::type_info*>(ptr_00,offset);
  *pptVar2 = (type_info *)&__objc_id_type_info;
  ptr_00->exception_class = cxx_exception_class;
  ptr_00->exception_cleanup = anon_unknown.dwarf_25210::exception_cleanup;
  lVar3 = __cxa_get_globals();
  *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
  return ptr_00;
}

Assistant:

struct _Unwind_Exception *objc_init_cxx_exception(id obj)
{
	id *newEx = static_cast<id*>(__cxa_allocate_exception(sizeof(id)));
	*newEx = obj;
	_Unwind_Exception *ex = pointer_add<_Unwind_Exception>(newEx, -exception_struct_size);
	*pointer_add<std::type_info*>(ex, type_info_offset) = &__objc_id_type_info;
	ex->exception_class = cxx_exception_class;
	ex->exception_cleanup = exception_cleanup;
	__cxa_get_globals()->uncaughtExceptions++;
	return ex;
}